

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_SecureChannel_sendChunk(UA_ChunkInfo *ci,UA_ByteString *dst,size_t offset)

{
  UA_UInt32 UVar1;
  UA_SecureChannel *pUVar2;
  UA_Connection *pUVar3;
  ushort uVar4;
  UA_StatusCode UVar5;
  size_t sStack_70;
  UA_StatusCode retval;
  size_t offset_header;
  undefined4 local_60;
  UA_SequenceHeader seqHeader;
  UA_SymmetricAlgorithmSecurityHeader symSecHeader;
  UA_String errorMsg;
  UA_SecureConversationMessageHeader respHeader;
  UA_Connection *connection;
  UA_SecureChannel *channel;
  size_t offset_local;
  UA_ByteString *dst_local;
  UA_ChunkInfo *ci_local;
  
  pUVar2 = ci->channel;
  pUVar3 = pUVar2->connection;
  if (pUVar3 == (UA_Connection *)0x0) {
    ci_local._4_4_ = 0x80020000;
  }
  else {
    dst->data = dst->data + -0x18;
    dst->length = dst->length + 0x18;
    channel = (UA_SecureChannel *)(offset + 0x18);
    if (((ulong)(pUVar3->remoteConf).maxMessageSize <
         (long)&channel->securityMode + ci->messageSizeSoFar) &&
       ((pUVar3->remoteConf).maxMessageSize != 0)) {
      ci->errorCode = 0x80b90000;
    }
    uVar4 = ci->chunksSoFar + 1;
    ci->chunksSoFar = uVar4;
    if (((pUVar3->remoteConf).maxChunkCount < (uint)uVar4) &&
       ((pUVar3->remoteConf).maxChunkCount != 0)) {
      ci->errorCode = 0x80b90000;
    }
    UVar1 = ci->messageType;
    offset_local = (size_t)dst;
    dst_local = (UA_ByteString *)ci;
    if (ci->errorCode == 0) {
      if ((ci->final & 1U) == 0) {
        errorMsg.data._4_4_ = UVar1 + 0x43000000;
      }
      else {
        errorMsg.data._4_4_ = UVar1 + 0x46000000;
      }
    }
    else {
      ci->final = true;
      errorMsg.data._4_4_ = UVar1 + 0x41000000;
      UA_String_init((UA_String *)&seqHeader.requestId);
      channel = (UA_SecureChannel *)0x18;
      UA_UInt32_encodeBinary
                ((UA_UInt32 *)((long)&dst_local[2].length + 4),(UA_ByteString *)offset_local,
                 (size_t *)&channel);
      UA_String_encodeBinary
                ((UA_String *)&seqHeader.requestId,(UA_ByteString *)offset_local,(size_t *)&channel)
      ;
    }
    dst_local[1].data = dst_local[1].data + (long)&channel->securityMode;
    seqHeader.sequenceNumber = (pUVar2->securityToken).tokenId;
    local_60 = *(undefined4 *)&dst_local->data;
    offset_header._4_4_ = UA_atomic_add(&pUVar2->sendSequenceNumber,1);
    sStack_70 = 0;
    UA_SecureConversationMessageHeader_encodeBinary
              ((UA_SecureConversationMessageHeader *)((long)&errorMsg.data + 4),
               (UA_ByteString *)offset_local,&stack0xffffffffffffff90);
    UA_SymmetricAlgorithmSecurityHeader_encodeBinary
              ((UA_SymmetricAlgorithmSecurityHeader *)&seqHeader,(UA_ByteString *)offset_local,
               &stack0xffffffffffffff90);
    UA_SequenceHeader_encodeBinary
              ((UA_SequenceHeader *)((long)&offset_header + 4),(UA_ByteString *)offset_local,
               &stack0xffffffffffffff90);
    *(UA_SecureChannel **)offset_local = channel;
    (*pUVar3->send)(pUVar2->connection,(UA_ByteString *)offset_local);
    if ((dst_local[2].length & 1) == 0) {
      UVar5 = (*pUVar3->getSendBuffer)
                        (pUVar3,(size_t)(pUVar3->localConf).sendBufferSize,
                         (UA_ByteString *)offset_local);
      if (UVar5 != 0) {
        return UVar5;
      }
      *(long *)(offset_local + 8) = *(long *)(offset_local + 8) + 0x18;
      *(ulong *)offset_local = (ulong)((pUVar3->localConf).sendBufferSize - 0x18);
    }
    ci_local._4_4_ = *(UA_StatusCode *)((long)&dst_local[2].length + 4);
  }
  return ci_local._4_4_;
}

Assistant:

static UA_StatusCode
UA_SecureChannel_sendChunk(UA_ChunkInfo *ci, UA_ByteString *dst, size_t offset) {
    UA_SecureChannel *channel = ci->channel;
    UA_Connection *connection = channel->connection;
    if(!connection)
       return UA_STATUSCODE_BADINTERNALERROR;

    /* adjust the buffer where the header was hidden */
    dst->data = &dst->data[-UA_SECURE_MESSAGE_HEADER_LENGTH];
    dst->length += UA_SECURE_MESSAGE_HEADER_LENGTH;
    offset += UA_SECURE_MESSAGE_HEADER_LENGTH;

    if(ci->messageSizeSoFar + offset > connection->remoteConf.maxMessageSize &&
       connection->remoteConf.maxMessageSize > 0)
        ci->errorCode = UA_STATUSCODE_BADRESPONSETOOLARGE;
    if(++ci->chunksSoFar > connection->remoteConf.maxChunkCount &&
       connection->remoteConf.maxChunkCount > 0)
        ci->errorCode = UA_STATUSCODE_BADRESPONSETOOLARGE;

    /* Prepare the chunk headers */
    UA_SecureConversationMessageHeader respHeader;
    respHeader.secureChannelId = channel->securityToken.channelId;
    respHeader.messageHeader.messageTypeAndChunkType = ci->messageType;
    if(ci->errorCode == UA_STATUSCODE_GOOD) {
        if(ci->final)
            respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_FINAL;
        else
            respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_INTERMEDIATE;
    } else {
        /* abort message */
        ci->final = true; /* mark as finished */
        respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_ABORT;
        UA_String errorMsg;
        UA_String_init(&errorMsg);
        offset = UA_SECURE_MESSAGE_HEADER_LENGTH;
        UA_UInt32_encodeBinary(&ci->errorCode, dst, &offset);
        UA_String_encodeBinary(&errorMsg, dst, &offset);
    }
    respHeader.messageHeader.messageSize = (UA_UInt32)offset;
    ci->messageSizeSoFar += offset;

    /* Encode the header at the beginning of the buffer */
    UA_SymmetricAlgorithmSecurityHeader symSecHeader;
    symSecHeader.tokenId = channel->securityToken.tokenId;
    UA_SequenceHeader seqHeader;
    seqHeader.requestId = ci->requestId;
    seqHeader.sequenceNumber = UA_atomic_add(&channel->sendSequenceNumber, 1);
    size_t offset_header = 0;
    UA_SecureConversationMessageHeader_encodeBinary(&respHeader, dst, &offset_header);
    UA_SymmetricAlgorithmSecurityHeader_encodeBinary(&symSecHeader, dst, &offset_header);
    UA_SequenceHeader_encodeBinary(&seqHeader, dst, &offset_header);

    /* Send the chunk, the buffer is freed in the network layer */
    dst->length = offset; /* set the buffer length to the content length */
    connection->send(channel->connection, dst);

    /* Replace with the buffer for the next chunk */
    if(!ci->final) {
        UA_StatusCode retval =
            connection->getSendBuffer(connection, connection->localConf.sendBufferSize, dst);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        /* Forward the data pointer so that the payload is encoded after the message header.
         * TODO: This works but is a bit too clever. Instead, we could return an offset to the
         * binary encoding exchangeBuffer function. */
        dst->data = &dst->data[UA_SECURE_MESSAGE_HEADER_LENGTH];
        dst->length = connection->localConf.sendBufferSize - UA_SECURE_MESSAGE_HEADER_LENGTH;
    }
    return ci->errorCode;
}